

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_rebels.cpp
# Opt level: O3

PClass * __thiscall ATeleporterBeacon::StaticType(ATeleporterBeacon *this)

{
  return RegistrationInfo.MyClass;
}

Assistant:

bool ATeleporterBeacon::Use (bool pickup)
{
	AInventory *drop;

	// Increase the amount by one so that when DropInventory decrements it,
	// the actor will have the same number of beacons that he started with.
	// When we return to UseInventory, it will take care of decrementing
	// Amount again and disposing of this item if there are no more.
	Amount++;
	drop = Owner->DropInventory (this);
	if (drop == NULL)
	{
		Amount--;
		return false;
	}
	else
	{
		drop->SetState(drop->FindState(NAME_Drop));
		drop->target = Owner;
		return true;
	}
}